

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O0

void convertARGBFromARGB32PM_sse4<true,false>(uint *buffer,uint *src,int count)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  undefined1 auVar9 [16];
  undefined1 auVar10 [12];
  float fVar11;
  float fVar12;
  float fVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  quint32 qVar22;
  undefined1 (*pauVar23) [16];
  undefined8 *puVar24;
  int in_EDX;
  undefined1 in_SIL;
  undefined7 in_register_00000031;
  long in_RDI;
  long in_FS_OFFSET;
  uint uVar26;
  float fVar27;
  undefined1 auVar25 [16];
  undefined8 extraout_XMM0_Qb;
  float fVar28;
  undefined1 in_XMM2 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  __m128 afVar31;
  uint v_1;
  int _i;
  __m128i srcVectorAlphaMask;
  __m128 ia4;
  __m128 ia3;
  __m128 ia2;
  __m128 ia1;
  __m128i src4;
  __m128i src2;
  __m128i src3;
  __m128i src1;
  __m128 ia;
  __m128 a;
  __m128i srcVectorAlpha;
  __m128i srcVector;
  __m128i zero;
  __m128i rgbaMask;
  __m128i alphaMask;
  uint v;
  int i;
  QRgb in_stack_fffffffffffffa40;
  QRgb in_stack_fffffffffffffa68;
  int local_58c;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  float local_4f8;
  float fStack_4f4;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  int local_480;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  byte local_358;
  byte bStack_357;
  byte bStack_356;
  byte bStack_355;
  byte bStack_354;
  byte bStack_353;
  byte bStack_352;
  byte bStack_351;
  byte bStack_330;
  byte bStack_32f;
  byte bStack_32e;
  byte bStack_32d;
  byte bStack_32c;
  byte bStack_32b;
  byte bStack_32a;
  byte bStack_329;
  short local_2e8;
  short sStack_2e6;
  short sStack_2e4;
  short sStack_2e2;
  short sStack_2e0;
  short sStack_2de;
  short sStack_2dc;
  short sStack_2da;
  short local_2d8;
  short sStack_2d6;
  short sStack_2d4;
  short sStack_2d2;
  short sStack_2d0;
  short sStack_2ce;
  short sStack_2cc;
  short sStack_2ca;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  uint local_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  uint uStack_204;
  uint uStack_1fc;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint uStack_1e4;
  uint uStack_1dc;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_480 = 0;
  if ((MXCSR & 0x80) == 0) {
    for (; local_480 < in_EDX; local_480 = local_480 + 1) {
      qUnpremultiply(in_stack_fffffffffffffa40);
      qVar22 = ARGB2RGBA(0);
      *(quint32 *)(in_RDI + (long)local_480 * 4) = qVar22;
    }
  }
  else {
    for (; local_480 < in_EDX + -3; local_480 = local_480 + 4) {
      pauVar23 = (undefined1 (*) [16])(CONCAT71(in_register_00000031,in_SIL) + (long)local_480 * 4);
      uVar14 = *(undefined8 *)(*pauVar23 + 8);
      auVar25._8_8_ = 0xff000000ff000000;
      auVar25._0_8_ = 0xff000000ff000000;
      if ((auVar25 & *pauVar23) == (undefined1  [16])0x0) {
        puVar24 = (undefined8 *)(in_RDI + (long)local_480 * 4);
        *puVar24 = 0;
        puVar24[1] = 0;
      }
      else {
        auVar29._8_8_ = 0xff000000ff000000;
        auVar29._0_8_ = 0xff000000ff000000;
        if ((auVar29 & ~*pauVar23) == (undefined1  [16])0x0) {
          puVar24 = (undefined8 *)(in_RDI + (long)local_480 * 4);
          auVar30._8_8_ = 0xf0c0d0e0b08090a;
          auVar30._0_8_ = 0x704050603000102;
          auVar25 = pshufb(*pauVar23,auVar30);
          local_2a8 = auVar25._0_8_;
          uStack_2a0 = auVar25._8_8_;
          *puVar24 = local_2a8;
          puVar24[1] = uStack_2a0;
        }
        else {
          local_218 = (uint)*(undefined8 *)*pauVar23;
          uStack_210 = (uint)uVar14;
          uVar26 = (uint)((ulong)*(undefined8 *)*pauVar23 >> 0x38);
          auVar15._8_8_ = 0xf0c0d0e0b08090a;
          auVar15._0_8_ = 0x704050603000102;
          auVar25 = pshufb(*pauVar23,auVar15);
          afVar31[1] = (float)uVar26;
          afVar31[0] = (float)(local_218 >> 0x18);
          afVar31[2] = 255.0;
          afVar31[3] = 0.0;
          afVar31 = reciprocal_mul_ps(afVar31,in_XMM2._0_4_);
          fVar27 = (float)extraout_XMM0_Qb;
          fVar28 = (float)((ulong)extraout_XMM0_Qb >> 0x20);
          local_358 = auVar25[0];
          bStack_357 = auVar25[1];
          bStack_356 = auVar25[2];
          bStack_355 = auVar25[3];
          bStack_354 = auVar25[4];
          bStack_353 = auVar25[5];
          bStack_352 = auVar25[6];
          bStack_351 = auVar25[7];
          bStack_330 = auVar25[8];
          bStack_32f = auVar25[9];
          bStack_32e = auVar25[10];
          bStack_32d = auVar25[0xb];
          bStack_32c = auVar25[0xc];
          bStack_32b = auVar25[0xd];
          bStack_32a = auVar25[0xe];
          bStack_329 = auVar25[0xf];
          uStack_520._0_4_ = (uint)bStack_352;
          uStack_530._0_4_ = (uint)bStack_32a;
          local_4f8 = afVar31[0];
          fStack_4f4 = afVar31[1];
          uStack_1d4 = (uint)bStack_357;
          uStack_1d0 = (uint)bStack_356;
          uStack_1cc = (uint)bStack_355;
          fVar11 = (float)uStack_1d4;
          fVar12 = (float)uStack_1d0;
          fVar13 = (float)uStack_1cc;
          uVar3 = CONCAT17((char)((uint)fVar11 >> 0x18),
                           CONCAT16((char)((uint)fVar11 >> 0x10),
                                    CONCAT15((char)((uint)fVar11 >> 8),
                                             CONCAT14(SUB41(fVar11,0),(float)local_358))));
          auVar4[8] = SUB41(fVar12,0);
          auVar4._0_8_ = uVar3;
          auVar4[9] = (char)((uint)fVar12 >> 8);
          auVar4[10] = (char)((uint)fVar12 >> 0x10);
          auVar4[0xb] = (char)((uint)fVar12 >> 0x18);
          auVar2[0xc] = SUB41(fVar13,0);
          auVar2._0_12_ = auVar4;
          auVar2[0xd] = (char)((uint)fVar13 >> 8);
          auVar2[0xe] = (char)((uint)fVar13 >> 0x10);
          auVar2[0xf] = (char)((uint)fVar13 >> 0x18);
          fStack_3f4 = (float)((ulong)uVar3 >> 0x20);
          fStack_3f0 = auVar4._8_4_;
          fStack_3ec = auVar2._12_4_;
          local_508 = CONCAT44((int)(fStack_3f4 * local_4f8),(int)((float)local_358 * local_4f8));
          uStack_500._0_4_ = (int)(fStack_3f0 * local_4f8);
          uStack_500._4_4_ = (int)(fStack_3ec * local_4f8);
          uStack_1e4 = (uint)bStack_353;
          uStack_1dc = (uint)bStack_351;
          fVar11 = (float)uStack_1e4;
          fVar12 = (float)(uint)uStack_520;
          fVar13 = (float)uStack_1dc;
          uVar3 = CONCAT17((char)((uint)fVar11 >> 0x18),
                           CONCAT16((char)((uint)fVar11 >> 0x10),
                                    CONCAT15((char)((uint)fVar11 >> 8),
                                             CONCAT14(SUB41(fVar11,0),(float)bStack_354))));
          auVar6[8] = SUB41(fVar12,0);
          auVar6._0_8_ = uVar3;
          auVar6[9] = (char)((uint)fVar12 >> 8);
          auVar6[10] = (char)((uint)fVar12 >> 0x10);
          auVar6[0xb] = (char)((uint)fVar12 >> 0x18);
          auVar5[0xc] = SUB41(fVar13,0);
          auVar5._0_12_ = auVar6;
          auVar5[0xd] = (char)((uint)fVar13 >> 8);
          auVar5[0xe] = (char)((uint)fVar13 >> 0x10);
          auVar5[0xf] = (char)((uint)fVar13 >> 0x18);
          fStack_414 = (float)((ulong)uVar3 >> 0x20);
          fStack_410 = auVar6._8_4_;
          fStack_40c = auVar5._12_4_;
          local_528 = CONCAT44((int)(fStack_414 * fStack_4f4),(int)((float)bStack_354 * fStack_4f4))
          ;
          uStack_520 = CONCAT44((int)(fStack_40c * fStack_4f4),(int)(fStack_410 * fStack_4f4));
          uStack_1f4 = (uint)bStack_32f;
          uStack_1f0 = (uint)bStack_32e;
          uStack_1ec = (uint)bStack_32d;
          fVar11 = (float)uStack_1f4;
          fVar12 = (float)uStack_1f0;
          fVar13 = (float)uStack_1ec;
          uVar3 = CONCAT17((char)((uint)fVar11 >> 0x18),
                           CONCAT16((char)((uint)fVar11 >> 0x10),
                                    CONCAT15((char)((uint)fVar11 >> 8),
                                             CONCAT14(SUB41(fVar11,0),(float)bStack_330))));
          auVar8[8] = SUB41(fVar12,0);
          auVar8._0_8_ = uVar3;
          auVar8[9] = (char)((uint)fVar12 >> 8);
          auVar8[10] = (char)((uint)fVar12 >> 0x10);
          auVar8[0xb] = (char)((uint)fVar12 >> 0x18);
          auVar7[0xc] = SUB41(fVar13,0);
          auVar7._0_12_ = auVar8;
          auVar7[0xd] = (char)((uint)fVar13 >> 8);
          auVar7[0xe] = (char)((uint)fVar13 >> 0x10);
          auVar7[0xf] = (char)((uint)fVar13 >> 0x18);
          fStack_434 = (float)((ulong)uVar3 >> 0x20);
          fStack_430 = auVar8._8_4_;
          fStack_42c = auVar7._12_4_;
          local_518 = CONCAT44((int)(fStack_434 * fVar27),(int)((float)bStack_330 * fVar27));
          uStack_510._0_4_ = (int)(fStack_430 * fVar27);
          uStack_510._4_4_ = (int)(fStack_42c * fVar27);
          uStack_204 = (uint)bStack_32b;
          uStack_1fc = (uint)bStack_329;
          fVar11 = (float)uStack_204;
          fVar12 = (float)(uint)uStack_530;
          fVar13 = (float)uStack_1fc;
          uVar3 = CONCAT17((char)((uint)fVar11 >> 0x18),
                           CONCAT16((char)((uint)fVar11 >> 0x10),
                                    CONCAT15((char)((uint)fVar11 >> 8),
                                             CONCAT14(SUB41(fVar11,0),(float)bStack_32c))));
          auVar10[8] = SUB41(fVar12,0);
          auVar10._0_8_ = uVar3;
          auVar10[9] = (char)((uint)fVar12 >> 8);
          auVar10[10] = (char)((uint)fVar12 >> 0x10);
          auVar10[0xb] = (char)((uint)fVar12 >> 0x18);
          auVar9[0xc] = SUB41(fVar13,0);
          auVar9._0_12_ = auVar10;
          auVar9[0xd] = (char)((uint)fVar13 >> 8);
          auVar9[0xe] = (char)((uint)fVar13 >> 0x10);
          auVar9[0xf] = (char)((uint)fVar13 >> 0x18);
          fStack_454 = (float)((ulong)uVar3 >> 0x20);
          fStack_450 = auVar10._8_4_;
          fStack_44c = auVar9._12_4_;
          local_538 = CONCAT44((int)(fStack_454 * fVar28),(int)((float)bStack_32c * fVar28));
          uStack_530 = CONCAT44((int)(fStack_44c * fVar28),(int)(fStack_450 * fVar28));
          auVar19._8_8_ = uStack_500;
          auVar19._0_8_ = local_508;
          auVar18._8_8_ = uStack_520;
          auVar18._0_8_ = local_528;
          auVar29 = packusdw(auVar19,auVar18);
          auVar17._8_8_ = uStack_510;
          auVar17._0_8_ = local_518;
          auVar16._8_8_ = uStack_530;
          auVar16._0_8_ = local_538;
          auVar30 = packusdw(auVar17,auVar16);
          local_2d8 = auVar29._0_2_;
          sStack_2d6 = auVar29._2_2_;
          sStack_2d4 = auVar29._4_2_;
          sStack_2d2 = auVar29._6_2_;
          sStack_2d0 = auVar29._8_2_;
          sStack_2ce = auVar29._10_2_;
          sStack_2cc = auVar29._12_2_;
          sStack_2ca = auVar29._14_2_;
          local_2e8 = auVar30._0_2_;
          sStack_2e6 = auVar30._2_2_;
          sStack_2e4 = auVar30._4_2_;
          sStack_2e2 = auVar30._6_2_;
          sStack_2e0 = auVar30._8_2_;
          sStack_2de = auVar30._10_2_;
          sStack_2dc = auVar30._12_2_;
          sStack_2da = auVar30._14_2_;
          local_508._0_2_ =
               CONCAT11((0 < sStack_2d6) * (sStack_2d6 < 0x100) * auVar29[2] - (0xff < sStack_2d6),
                        (0 < local_2d8) * (local_2d8 < 0x100) * auVar29[0] - (0xff < local_2d8));
          local_508._0_3_ =
               CONCAT12((0 < sStack_2d4) * (sStack_2d4 < 0x100) * auVar29[4] - (0xff < sStack_2d4),
                        (undefined2)local_508);
          local_508._0_4_ =
               CONCAT13((0 < sStack_2d2) * (sStack_2d2 < 0x100) * auVar29[6] - (0xff < sStack_2d2),
                        (undefined3)local_508);
          local_508._0_5_ =
               CONCAT14((0 < sStack_2d0) * (sStack_2d0 < 0x100) * auVar29[8] - (0xff < sStack_2d0),
                        (undefined4)local_508);
          local_508._0_6_ =
               CONCAT15((0 < sStack_2ce) * (sStack_2ce < 0x100) * auVar29[10] - (0xff < sStack_2ce),
                        (undefined5)local_508);
          local_508._0_7_ =
               CONCAT16((0 < sStack_2cc) * (sStack_2cc < 0x100) * auVar29[0xc] - (0xff < sStack_2cc)
                        ,(undefined6)local_508);
          local_508 = CONCAT17((0 < sStack_2ca) * (sStack_2ca < 0x100) * auVar29[0xe] -
                               (0xff < sStack_2ca),(undefined7)local_508);
          uStack_500._0_1_ = (0 < local_2e8) * (local_2e8 < 0x100) * auVar30[0] - (0xff < local_2e8)
          ;
          uStack_500._1_1_ =
               (0 < sStack_2e6) * (sStack_2e6 < 0x100) * auVar30[2] - (0xff < sStack_2e6);
          uStack_500._2_1_ =
               (0 < sStack_2e4) * (sStack_2e4 < 0x100) * auVar30[4] - (0xff < sStack_2e4);
          uStack_500._3_1_ =
               (0 < sStack_2e2) * (sStack_2e2 < 0x100) * auVar30[6] - (0xff < sStack_2e2);
          uStack_500._4_1_ =
               (0 < sStack_2e0) * (sStack_2e0 < 0x100) * auVar30[8] - (0xff < sStack_2e0);
          uStack_500._5_1_ =
               (0 < sStack_2de) * (sStack_2de < 0x100) * auVar30[10] - (0xff < sStack_2de);
          uStack_500._6_1_ =
               (0 < sStack_2dc) * (sStack_2dc < 0x100) * auVar30[0xc] - (0xff < sStack_2dc);
          uStack_500._7_1_ =
               (0 < sStack_2da) * (sStack_2da < 0x100) * auVar30[0xe] - (0xff < sStack_2da);
          local_588 = CONCAT44(-(uint)(uVar26 == 0),-(uint)(local_218 >> 0x18 == 0));
          uStack_580 = CONCAT44(-(uint)((uint)((ulong)uVar14 >> 0x38) == 0),
                                -(uint)(uStack_210 >> 0x18 == 0));
          auVar21._8_8_ = (uStack_580 ^ 0xffffffffffffffff) & uStack_500;
          auVar21._0_8_ = (local_588 ^ 0xffffffffffffffff) & local_508;
          auVar20._8_8_ = 0xff000000ff000000;
          auVar20._0_8_ = 0xff000000ff000000;
          auVar29 = pblendvb(auVar21,auVar25,auVar20);
          puVar24 = (undefined8 *)(in_RDI + (long)local_480 * 4);
          local_4c8 = auVar29._0_8_;
          uStack_4c0 = auVar29._8_8_;
          *puVar24 = local_4c8;
          puVar24[1] = uStack_4c0;
          in_XMM2 = auVar25;
        }
      }
    }
    for (local_58c = 0; local_58c < 3 && local_480 < in_EDX; local_58c = local_58c + 1) {
      qUnpremultiply_sse4(in_stack_fffffffffffffa68);
      qVar22 = ARGB2RGBA(0);
      *(quint32 *)(in_RDI + (long)local_480 * 4) = qVar22;
      local_480 = local_480 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void convertARGBFromARGB32PM_sse4(uint *buffer, const uint *src, int count)
{
    int i = 0;
    if ((_MM_GET_EXCEPTION_MASK() & _MM_MASK_INVALID) == 0) {
        for (; i < count; ++i) {
            uint v = qUnpremultiply(src[i]);
            if (RGBx)
                v = 0xff000000 | v;
            if (RGBA)
                v = ARGB2RGBA(v);
            buffer[i] = v;
        }
        return;
    }
    const __m128i alphaMask = _mm_set1_epi32(0xff000000);
    const __m128i rgbaMask = _mm_setr_epi8(2, 1, 0, 3, 6, 5, 4, 7, 10, 9, 8, 11, 14, 13, 12, 15);
    const __m128i zero = _mm_setzero_si128();

    for (; i < count - 3; i += 4) {
        __m128i srcVector = _mm_loadu_si128((const __m128i *)&src[i]);
        if (!_mm_testz_si128(srcVector, alphaMask)) {
            if (!_mm_testc_si128(srcVector, alphaMask)) {
                __m128i srcVectorAlpha = _mm_srli_epi32(srcVector, 24);
                if (RGBA)
                    srcVector = _mm_shuffle_epi8(srcVector, rgbaMask);
                const __m128 a = _mm_cvtepi32_ps(srcVectorAlpha);
                const __m128 ia = reciprocal_mul_ps(a, 255.0f);
                __m128i src1 = _mm_unpacklo_epi8(srcVector, zero);
                __m128i src3 = _mm_unpackhi_epi8(srcVector, zero);
                __m128i src2 = _mm_unpackhi_epi16(src1, zero);
                __m128i src4 = _mm_unpackhi_epi16(src3, zero);
                src1 = _mm_unpacklo_epi16(src1, zero);
                src3 = _mm_unpacklo_epi16(src3, zero);
                __m128 ia1 = _mm_shuffle_ps(ia, ia, _MM_SHUFFLE(0, 0, 0, 0));
                __m128 ia2 = _mm_shuffle_ps(ia, ia, _MM_SHUFFLE(1, 1, 1, 1));
                __m128 ia3 = _mm_shuffle_ps(ia, ia, _MM_SHUFFLE(2, 2, 2, 2));
                __m128 ia4 = _mm_shuffle_ps(ia, ia, _MM_SHUFFLE(3, 3, 3, 3));
                src1 = _mm_cvtps_epi32(_mm_mul_ps(_mm_cvtepi32_ps(src1), ia1));
                src2 = _mm_cvtps_epi32(_mm_mul_ps(_mm_cvtepi32_ps(src2), ia2));
                src3 = _mm_cvtps_epi32(_mm_mul_ps(_mm_cvtepi32_ps(src3), ia3));
                src4 = _mm_cvtps_epi32(_mm_mul_ps(_mm_cvtepi32_ps(src4), ia4));
                src1 = _mm_packus_epi32(src1, src2);
                src3 = _mm_packus_epi32(src3, src4);
                src1 = _mm_packus_epi16(src1, src3);
                // Handle potential alpha == 0 values:
                __m128i srcVectorAlphaMask = _mm_cmpeq_epi32(srcVectorAlpha, zero);
                src1 = _mm_andnot_si128(srcVectorAlphaMask, src1);
                // Fixup alpha values:
                if (RGBx)
                    srcVector = _mm_or_si128(src1, alphaMask);
                else
                    srcVector = _mm_blendv_epi8(src1, srcVector, alphaMask);
                _mm_storeu_si128((__m128i *)&buffer[i], srcVector);
            } else {
                if (RGBA)
                    _mm_storeu_si128((__m128i *)&buffer[i], _mm_shuffle_epi8(srcVector, rgbaMask));
                else if (buffer != src)
                    _mm_storeu_si128((__m128i *)&buffer[i], srcVector);
            }
        } else {
            if (RGBx)
                _mm_storeu_si128((__m128i *)&buffer[i], alphaMask);
            else
                _mm_storeu_si128((__m128i *)&buffer[i], zero);
        }
    }

    SIMD_EPILOGUE(i, count, 3) {
        uint v = qUnpremultiply_sse4(src[i]);
        if (RGBx)
            v = 0xff000000 | v;
        if (RGBA)
            v = ARGB2RGBA(v);
        buffer[i] = v;
    }
}